

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::to_ptr_expression_abi_cxx11_
          (CompilerMSL *this,uint32_t id,bool register_expression_read)

{
  bool bVar1;
  byte in_CL;
  undefined7 in_register_00000011;
  undefined4 in_register_00000034;
  CompilerGLSL *this_00;
  undefined1 local_80 [48];
  undefined1 local_50 [48];
  SPIRExpression *e;
  bool register_expression_read_local;
  CompilerGLSL *pCStack_18;
  uint32_t id_local;
  CompilerMSL *this_local;
  string *expr;
  
  this_00 = (CompilerGLSL *)CONCAT44(in_register_00000034,id);
  e._4_4_ = (uint32_t)CONCAT71(in_register_00000011,register_expression_read);
  e._3_1_ = in_CL & 1;
  pCStack_18 = this_00;
  this_local = this;
  local_50._40_8_ = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this_00,e._4_4_);
  local_50[0x27] = '\0';
  if (((SPIRExpression *)local_50._40_8_ == (SPIRExpression *)0x0) ||
     ((((SPIRExpression *)local_50._40_8_)->need_transpose & 1U) == 0)) {
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_50,id,SUB41(e._4_4_,0));
  }
  else {
    ::std::__cxx11::string::string
              ((string *)local_50,(string *)&((SPIRExpression *)local_50._40_8_)->expression);
  }
  CompilerGLSL::enclose_expression(&this->super_CompilerGLSL,(string *)this_00);
  ::std::__cxx11::string::~string((string *)local_50);
  bVar1 = CompilerGLSL::should_dereference(this_00,e._4_4_);
  if (!bVar1) {
    CompilerGLSL::address_of_expression((CompilerGLSL *)local_80,(string *)this_00);
    ::std::__cxx11::string::operator=((string *)this,(string *)local_80);
    ::std::__cxx11::string::~string((string *)local_80);
  }
  return this;
}

Assistant:

string CompilerMSL::to_ptr_expression(uint32_t id, bool register_expression_read)
{
	auto *e = maybe_get<SPIRExpression>(id);
	auto expr = enclose_expression(e && e->need_transpose ? e->expression : to_expression(id, register_expression_read));
	if (!should_dereference(id))
		expr = address_of_expression(expr);
	return expr;
}